

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O0

Vertex * __thiscall
TRM::ObjectHeap::Allocate<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>const&>
          (ObjectHeap *this,vec<2,_float,_(glm::qualifier)0> *args)

{
  reference this_00;
  Vertex *pVVar1;
  vec<2,_float,_(glm::qualifier)0> local_20;
  vec<2,_float,_(glm::qualifier)0> *local_18;
  vec<2,_float,_(glm::qualifier)0> *args_local;
  ObjectHeap *this_local;
  
  local_18 = args;
  args_local = (vec<2,_float,_(glm::qualifier)0> *)this;
  std::make_unique<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>const&>(&local_20);
  std::
  vector<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>,std::allocator<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>>>
  ::emplace_back<std::unique_ptr<TRM::Vertex,std::default_delete<TRM::Vertex>>>
            ((vector<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>,std::allocator<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>>>
              *)this,(unique_ptr<TRM::Vertex,_std::default_delete<TRM::Vertex>_> *)&local_20);
  std::unique_ptr<TRM::Vertex,_std::default_delete<TRM::Vertex>_>::~unique_ptr
            ((unique_ptr<TRM::Vertex,_std::default_delete<TRM::Vertex>_> *)&local_20);
  this_00 = std::
            vector<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
            ::back(&this->objs_);
  pVVar1 = (Vertex *)std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>::get(this_00);
  return pVVar1;
}

Assistant:

T* Allocate(Args&&... args) {
    objs_.emplace_back(std::make_unique<T>(std::forward<Args>(args)...));

    return static_cast<T*>(objs_.back().get());
  }